

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::sdiv(APInt *this,APInt *RHS)

{
  anon_union_8_2_1313ab2f_for_U aVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  APInt *in_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  ulong uVar6;
  APInt AVar7;
  anon_union_8_2_1313ab2f_for_U local_a8;
  uint local_a0;
  anon_union_8_2_1313ab2f_for_U local_98;
  uint local_90;
  anon_union_8_2_1313ab2f_for_U local_88;
  uint local_80;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70;
  anon_union_8_2_1313ab2f_for_U local_68;
  uint local_60;
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  bVar3 = operator[](RHS,RHS->BitWidth - 1);
  bVar4 = operator[](in_RDX,in_RDX->BitWidth - 1);
  if (bVar3) {
    if (bVar4) {
      local_60 = RHS->BitWidth;
      if ((ulong)local_60 < 0x41) {
        local_68 = RHS->U;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_60 + 0x3f >> 3) & 0xfffffff8);
        local_68.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_68.pVal,(RHS->U).pVal,uVar6);
      }
      flipAllBits((APInt *)&local_68);
      operator++((APInt *)&local_68);
      local_a0 = local_60;
      local_a8 = local_68;
      local_60 = 0;
      local_70 = in_RDX->BitWidth;
      if ((ulong)local_70 < 0x41) {
        local_78.pVal = *(uint64_t **)&in_RDX->U;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_70 + 0x3f >> 3) & 0xfffffff8);
        local_78.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_78.pVal,(in_RDX->U).pVal,uVar6);
      }
      flipAllBits((APInt *)&local_78);
      operator++((APInt *)&local_78);
      local_50 = local_70;
      local_58.VAL = local_78.VAL;
      local_70 = 0;
      AVar7 = udiv(this,(APInt *)&local_a8);
      uVar5 = AVar7._8_8_;
      if ((0x40 < local_50) && (local_58.VAL != 0)) {
        operator_delete__(local_58.pVal);
        uVar5 = extraout_RDX_03;
      }
      if ((0x40 < local_70) && (local_78.VAL != 0)) {
        operator_delete__(local_78.pVal);
        uVar5 = extraout_RDX_04;
      }
      aVar1 = local_68;
      uVar2 = local_60;
      if ((0x40 < local_a0) && (local_a8.VAL != 0)) {
        operator_delete__(local_a8.pVal);
        uVar5 = extraout_RDX_05;
        aVar1 = local_68;
        uVar2 = local_60;
      }
    }
    else {
      local_80 = RHS->BitWidth;
      if ((ulong)local_80 < 0x41) {
        local_88 = RHS->U;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_80 + 0x3f >> 3) & 0xfffffff8);
        local_88.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_88.pVal,(RHS->U).pVal,uVar6);
      }
      flipAllBits((APInt *)&local_88);
      operator++((APInt *)&local_88);
      local_a0 = local_80;
      local_a8 = local_88;
      local_80 = 0;
      udiv((APInt *)&local_38,(APInt *)&local_a8);
      flipAllBits((APInt *)&local_38);
      operator++((APInt *)&local_38);
      this->BitWidth = local_30;
      this->U = local_38;
      local_30 = 0;
      uVar5 = extraout_RDX_01;
      aVar1 = local_88;
      uVar2 = local_80;
      if ((0x40 < local_a0) && (local_a8.VAL != 0)) {
        operator_delete__(local_a8.pVal);
        uVar5 = extraout_RDX_02;
        aVar1 = local_88;
        uVar2 = local_80;
      }
    }
  }
  else {
    if (!bVar4) {
      AVar7 = udiv(this,RHS);
      uVar5 = AVar7._8_8_;
      goto LAB_001831a3;
    }
    local_90 = in_RDX->BitWidth;
    if ((ulong)local_90 < 0x41) {
      local_98.pVal = *(uint64_t **)&in_RDX->U;
    }
    else {
      uVar6 = (ulong)((uint)((ulong)local_90 + 0x3f >> 3) & 0xfffffff8);
      local_98.pVal = (uint64_t *)operator_new__(uVar6);
      memcpy(local_98.pVal,(in_RDX->U).pVal,uVar6);
    }
    flipAllBits((APInt *)&local_98);
    operator++((APInt *)&local_98);
    local_a0 = local_90;
    local_a8 = local_98;
    local_90 = 0;
    udiv((APInt *)&local_48,RHS);
    flipAllBits((APInt *)&local_48);
    operator++((APInt *)&local_48);
    this->BitWidth = local_40;
    this->U = local_48;
    local_40 = 0;
    uVar5 = extraout_RDX;
    aVar1 = local_98;
    uVar2 = local_90;
    if ((0x40 < local_a0) && (local_a8.VAL != 0)) {
      operator_delete__(local_a8.pVal);
      uVar5 = extraout_RDX_00;
      aVar1 = local_98;
      uVar2 = local_90;
    }
  }
  if ((0x40 < uVar2) && ((void *)aVar1.VAL != (void *)0x0)) {
    operator_delete__(aVar1.pVal);
    uVar5 = extraout_RDX_06;
  }
LAB_001831a3:
  AVar7._8_8_ = uVar5;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt APInt::sdiv(const APInt &RHS) const {
  if (isNegative()) {
    if (RHS.isNegative())
      return (-(*this)).udiv(-RHS);
    return -((-(*this)).udiv(RHS));
  }
  if (RHS.isNegative())
    return -(this->udiv(-RHS));
  return this->udiv(RHS);
}